

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderImageLoadStoreTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::getFunctionName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,ImageOperation function)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  allocator<char> local_10;
  allocator<char> local_f;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "imageStore";
    __a = &local_9;
    break;
  case 1:
    __s = "imageLoad";
    __a = &local_a;
    break;
  case 2:
    __s = "imageAtomicAdd";
    __a = &local_b;
    break;
  case 3:
    __s = "imageAtomicMin";
    __a = &local_c;
    break;
  case 4:
    __s = "imageAtomicMax";
    __a = &local_d;
    break;
  case 5:
    __s = "imageAtomicAnd";
    __a = &local_e;
    break;
  case 6:
    __s = "imageAtomicOr";
    __a = &local_f;
    break;
  case 7:
    __s = "imageAtomicXor";
    __a = &local_10;
    break;
  case 8:
    __s = "imageAtomicExchange";
    __a = &local_11;
    break;
  case 9:
    __s = "imageAtomicCompSwap";
    __a = &local_12;
    break;
  default:
    __s = glcts::fixed_sample_locations_values + 1;
    __a = &local_13;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string getFunctionName (ImageOperation function)
{
	switch (function)
	{
		case IMAGE_OPERATION_STORE:				return std::string("imageStore");
		case IMAGE_OPERATION_LOAD:				return std::string("imageLoad");
		case IMAGE_OPERATION_ATOMIC_ADD:		return std::string("imageAtomicAdd");
		case IMAGE_OPERATION_ATOMIC_MIN:		return std::string("imageAtomicMin");
		case IMAGE_OPERATION_ATOMIC_MAX:		return std::string("imageAtomicMax");
		case IMAGE_OPERATION_ATOMIC_AND:		return std::string("imageAtomicAnd");
		case IMAGE_OPERATION_ATOMIC_OR:			return std::string("imageAtomicOr");
		case IMAGE_OPERATION_ATOMIC_XOR:		return std::string("imageAtomicXor");
		case IMAGE_OPERATION_ATOMIC_EXCHANGE:	return std::string("imageAtomicExchange");
		case IMAGE_OPERATION_ATOMIC_COMP_SWAP:	return std::string("imageAtomicCompSwap");
		default:
			DE_ASSERT(DE_FALSE);
	}
	return std::string("");
}